

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O2

Raster * rw::gl3::rasterCreate(Raster *raster)

{
  FILE *__stream;
  long lVar1;
  char *pcVar2;
  int iVar3;
  int32 iVar4;
  Error _e;
  Error local_20;
  
  lVar1 = (long)nativeRasterOffset;
  *(undefined2 *)((long)&raster->width + lVar1) = 0;
  *(undefined1 *)((long)&raster->width + lVar1 + 3) = 1;
  iVar3 = raster->height;
  if (raster->width != 0) {
    if (iVar3 != 0) {
      if ((raster->flags & 0x80) == 0) {
        local_20.plugin = 0xb00;
        local_20.code = 0x8000000a;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/gl3raster.cpp"
                ,0x1a9);
        __stream = _stderr;
        pcVar2 = dbgsprint(0x8000000a);
        fprintf(__stream,"%s\n",pcVar2);
        setError(&local_20);
        return (Raster *)0x0;
      }
      iVar4 = raster->stride;
      goto LAB_00114f08;
    }
    iVar3 = 0;
  }
  *(byte *)&raster->flags = (byte)raster->flags | 0x80;
  raster->stride = 0;
  iVar4 = 0;
LAB_00114f08:
  raster->originalWidth = raster->width;
  raster->originalHeight = iVar3;
  raster->originalStride = iVar4;
  raster->originalPixels = raster->pixels;
  return raster;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	Gl3Raster *natras = GETGL3RASTEREXT(raster);

	natras->isCompressed = 0;
	natras->hasAlpha = 0;
	natras->numLevels = 1;

	Raster *ret = raster;

	if(raster->width == 0 || raster->height == 0){
		raster->flags |= Raster::DONTALLOCATE;
		raster->stride = 0;
		goto ret;
	}
	if(raster->flags & Raster::DONTALLOCATE)
		goto ret;

	switch(raster->type){
#ifdef RW_OPENGL
	case Raster::NORMAL:
	case Raster::TEXTURE:
		ret = rasterCreateTexture(raster);
		break;
	case Raster::CAMERATEXTURE:
		ret = rasterCreateCameraTexture(raster);
		break;
	case Raster::ZBUFFER:
		ret = rasterCreateZbuffer(raster);
		break;
	case Raster::CAMERA:
		ret = rasterCreateCamera(raster);
		break;
#endif

	default:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

ret:
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalStride = raster->stride;
	raster->originalPixels = raster->pixels;
	return ret;
}